

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint ON_SubDEdgeChain::OrientEdgesIntoEdgeChains
               (ON_SimpleArray<const_ON_SubDEdge_*> *edges,
               ON_SimpleArray<ON_SubDEdgePtr> *edge_chains)

{
  ON_SubDEdge *pOVar1;
  ON_SubDEdgePtr *pOVar2;
  ON_SubDEdgePtr *pOVar3;
  ON_SubDEdge *pOVar4;
  int iVar5;
  int iVar6;
  ON_SubDEdgePtr *pOVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ON_SubDEdge *edge;
  ulong uVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  ulong new_capacity;
  int iVar7;
  
  new_capacity = (ulong)(uint)edges->m_count;
  if (-1 < (long)edge_chains->m_capacity) {
    edge_chains->m_count = 0;
  }
  if ((ulong)(long)edge_chains->m_capacity < new_capacity) {
    ON_SimpleArray<ON_SubDEdgePtr>::SetCapacity(edge_chains,new_capacity);
  }
  if (new_capacity == 0) {
    uVar9 = 0;
  }
  else {
    uVar18 = 0;
    uVar9 = 0;
    iVar6 = 0;
    pOVar2 = (ON_SubDEdgePtr *)0x0;
    do {
      pOVar4 = edges->m_a[uVar18];
      if (((pOVar4 != (ON_SubDEdge *)0x0) && (pOVar4->m_vertex[0] != (ON_SubDVertex *)0x0)) &&
         (pOVar4->m_vertex[0] != pOVar4->m_vertex[1] && pOVar4->m_vertex[1] != (ON_SubDVertex *)0x0)
         ) {
        pOVar3 = ON_SimpleArray<ON_SubDEdgePtr>::AppendNew(edge_chains);
        pOVar3->m_ptr = (ON__UINT_PTR)pOVar4;
        uVar10 = 1;
        iVar5 = 0;
        uVar16 = uVar10;
        iVar7 = iVar5;
        if (pOVar2 != (ON_SubDEdgePtr *)0x0) {
          pOVar1 = (ON_SubDEdge *)pOVar2->m_ptr;
          uVar13 = (ulong)pOVar1 & 0xfffffffffffffff8;
          if (uVar13 == 0) {
            lVar15 = 0;
          }
          else {
            lVar15 = *(long *)(uVar13 + 0x80 + (ulong)(~(uint)pOVar1 & 1) * 8);
          }
          uVar11 = (ulong)pOVar4 & 0xfffffffffffffff8;
          if (uVar11 == 0) {
            lVar14 = 0;
          }
          else {
            lVar14 = *(long *)(uVar11 + 0x80 + (ulong)((uint)pOVar4 & 1) * 8);
          }
          uVar16 = uVar9;
          iVar7 = iVar6;
          if (lVar15 != lVar14) {
            if (uVar13 == 0) {
              lVar15 = 0;
              lVar14 = 0;
            }
            else {
              uVar16 = (uint)pOVar1 & 1;
              lVar15 = *(long *)(uVar13 + 0x80 + (ulong)uVar16 * 8);
              lVar14 = *(long *)(uVar13 + 0x80 + (ulong)(uVar16 ^ 1) * 8);
            }
            if (uVar11 == 0) {
              lVar17 = 0;
              lVar12 = 0;
            }
            else {
              uVar16 = (uint)pOVar4 & 1;
              lVar17 = *(long *)(uVar11 + 0x80 + (ulong)uVar16 * 8);
              lVar12 = *(long *)(uVar11 + 0x80 + (ulong)(uVar16 ^ 1) * 8);
            }
            pOVar8 = pOVar3;
            if (lVar14 != lVar12) {
              uVar16 = uVar10;
              iVar7 = iVar5;
              if (iVar6 != 1) goto LAB_005eec6c;
              if (lVar15 == lVar17) {
                iVar6 = 1;
                pOVar4 = pOVar1;
                pOVar8 = pOVar2;
              }
              else {
                if (lVar15 != lVar12) goto LAB_005eec6c;
                pOVar2->m_ptr = (ulong)pOVar1 & 0xfffffffffffffff9 ^ 1;
                pOVar4 = (ON_SubDEdge *)pOVar3->m_ptr;
                iVar6 = 1;
              }
            }
            pOVar8->m_ptr = (ulong)pOVar4 & 0xfffffffffffffff9 ^ 1;
            uVar16 = uVar9;
            iVar7 = iVar6;
          }
        }
LAB_005eec6c:
        uVar9 = uVar16;
        iVar6 = iVar7 + 1;
        pOVar2 = pOVar3;
      }
      uVar18 = uVar18 + 1;
    } while (new_capacity != uVar18);
  }
  return uVar9;
}

Assistant:

unsigned int ON_SubDEdgeChain::OrientEdgesIntoEdgeChains(
  const ON_SimpleArray< const ON_SubDEdge* >& edges,
  ON_SimpleArray< ON_SubDEdgePtr >& edge_chains
)
{
  const unsigned count = edges.UnsignedCount();
  edge_chains.SetCount(0);
  edge_chains.Reserve(count);
  unsigned int chain_count = 0;
  unsigned chain_length = 0;
  ON_SubDEdgePtr* prev_eptr = nullptr;
  for (unsigned i = 0; i < count; ++i)
  {
    const ON_SubDEdge* e = edges[i];
    if (nullptr == e || nullptr == e->m_vertex[0] || nullptr == e->m_vertex[1] || e->m_vertex[0] == e->m_vertex[1])
      continue;
    ON_SubDEdgePtr& eptr = edge_chains.AppendNew();
    eptr = ON_SubDEdgePtr::Create(e);
    if (nullptr != prev_eptr && prev_eptr->RelativeVertex(1) != eptr.RelativeVertex(0) )
    {
      const ON_SubDVertex* prev_v[2] = { prev_eptr->RelativeVertex(0), prev_eptr->RelativeVertex(1) };
      const ON_SubDVertex* v[2] = { eptr.RelativeVertex(0), eptr.RelativeVertex(1) };
      if (prev_v[1] == v[1])
        eptr = eptr.Reversed();
      else if (1 == chain_length)
      {
        if (prev_v[0] == v[0])
          *prev_eptr = prev_eptr->Reversed();
        else if (prev_v[0] == v[1])
        {
          *prev_eptr = prev_eptr->Reversed();
          eptr = eptr.Reversed();
        }
        else
          prev_eptr = nullptr;
      }
      else
        prev_eptr = nullptr;
    }

    if (nullptr == prev_eptr)
    {
      chain_count = 1;
      chain_length = 0;
    }
    prev_eptr = &eptr;
    ++chain_length;
  }
  return chain_count;
}